

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O2

avl_node * avl_first(avl_tree *tree)

{
  avl_node *paVar1;
  avl_node *paVar2;
  
  paVar2 = (avl_node *)0x0;
  do {
    paVar1 = paVar2;
    paVar2 = tree->root;
    tree = (avl_tree *)&paVar2->left;
  } while (paVar2 != (avl_node *)0x0);
  return paVar1;
}

Assistant:

struct avl_node* avl_first(struct avl_tree *tree)
{
    struct avl_node *p = NULL;
    struct avl_node *node = tree->root;

    while(node) {
        p = node;
        node = node->left;
    }
    return p;
}